

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O1

Vec_Int_t * Gia_GlaConvertToFla(Gia_Man_t *p,Vec_Int_t *vGla)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *__s;
  int iVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  
  iVar1 = p->nRegs;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  iVar5 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar5 = iVar1;
  }
  pVVar4->nSize = 0;
  pVVar4->nCap = iVar5;
  if (iVar5 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar5 << 2);
  }
  pVVar4->pArray = __s;
  pVVar4->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 * 4);
  }
  iVar5 = p->nRegs;
  if (0 < (long)iVar5) {
    pVVar3 = p->vCis;
    lVar6 = 0;
    do {
      uVar2 = pVVar3->nSize;
      uVar8 = (ulong)(uint)-iVar5 + lVar6 + (ulong)uVar2;
      iVar7 = (int)uVar8;
      if ((iVar7 < 0) || ((int)uVar2 <= iVar7)) {
LAB_0061f936:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar7 = pVVar3->pArray[uVar8 & 0xffffffff];
      if (((long)iVar7 < 0) || (p->nObjs <= iVar7)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar4;
      }
      if (vGla->nSize <= iVar7) goto LAB_0061f936;
      if (vGla->pArray[iVar7] != 0) {
        if (iVar1 <= lVar6) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        __s[lVar6] = 1;
      }
      lVar6 = lVar6 + 1;
    } while (iVar5 != lVar6);
  }
  return pVVar4;
}

Assistant:

Vec_Int_t * Gia_GlaConvertToFla( Gia_Man_t * p, Vec_Int_t * vGla )
{
    Vec_Int_t * vFla;
    Gia_Obj_t * pObj;
    int i;
    vFla = Vec_IntStart( Gia_ManRegNum(p) );
    Gia_ManForEachRo( p, pObj, i )
        if ( Vec_IntEntry(vGla, Gia_ObjId(p, pObj)) )
            Vec_IntWriteEntry( vFla, i, 1 );
    return vFla;
}